

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O3

void av1_set_svc_fixed_mode(AV1_COMP *cpi)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  AV1_PRIMARY *pAVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  long lVar8;
  
  pAVar4 = cpi->ppi;
  (pAVar4->rtc_ref).set_ref_frame_config = 1;
  uVar2 = (cpi->svc).current_superframe;
  piVar1 = (pAVar4->rtc_ref).ref_idx;
  (pAVar4->rtc_ref).reference[1] = 0;
  (pAVar4->rtc_ref).reference[2] = 0;
  (pAVar4->rtc_ref).reference[3] = 0;
  (pAVar4->rtc_ref).reference[4] = 0;
  (pAVar4->rtc_ref).reference[5] = 0;
  auVar5 = _DAT_00bfdd80;
  (pAVar4->rtc_ref).reference[6] = 0;
  lVar6 = 0;
  auVar7 = _DAT_00c0d0d0;
  do {
    if (SUB164(auVar7 ^ auVar5,4) == -0x80000000 && SUB164(auVar7 ^ auVar5,0) < -0x7ffffff9) {
      (pAVar4->rtc_ref).ref_idx[lVar6] = (int)lVar6;
      (pAVar4->rtc_ref).ref_idx[lVar6 + 1] = (int)lVar6 + 1;
    }
    lVar6 = lVar6 + 2;
    lVar8 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar8 + 2;
  } while (lVar6 != 8);
  (pAVar4->rtc_ref).refresh[4] = 0;
  (pAVar4->rtc_ref).refresh[5] = 0;
  (pAVar4->rtc_ref).refresh[6] = 0;
  (pAVar4->rtc_ref).refresh[7] = 0;
  (pAVar4->rtc_ref).refresh[0] = 0;
  (pAVar4->rtc_ref).refresh[1] = 0;
  (pAVar4->rtc_ref).refresh[2] = 0;
  (pAVar4->rtc_ref).refresh[3] = 0;
  (pAVar4->rtc_ref).reference[0] = 1;
  if (0 < (cpi->svc).spatial_layer_id) {
    (pAVar4->rtc_ref).reference[3] = 1;
  }
  iVar3 = (cpi->svc).temporal_layer_id;
  if (iVar3 != 2) {
    if (iVar3 == 1) {
      iVar3 = (cpi->svc).spatial_layer_id;
      if (iVar3 == 0) {
        (pAVar4->rtc_ref).ref_idx[3] = 0;
        (pAVar4->rtc_ref).ref_idx[4] = 0;
        (pAVar4->rtc_ref).ref_idx[5] = 0;
        (pAVar4->rtc_ref).ref_idx[6] = 0;
        piVar1[0] = 0;
        piVar1[1] = 0;
        piVar1[2] = 0;
        piVar1[3] = 0;
        if (((cpi->svc).number_temporal_layers + -1 <= (cpi->svc).temporal_layer_id) &&
           ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id)) {
          return;
        }
        (pAVar4->rtc_ref).ref_idx[3] = 5;
        (pAVar4->rtc_ref).refresh[5] = 1;
        return;
      }
      if (iVar3 != 1) {
        if (iVar3 != 2) {
          return;
        }
        (pAVar4->rtc_ref).ref_idx[2] = 6;
        (pAVar4->rtc_ref).ref_idx[3] = 6;
        (pAVar4->rtc_ref).ref_idx[4] = 6;
        (pAVar4->rtc_ref).ref_idx[5] = 6;
        (pAVar4->rtc_ref).ref_idx[6] = 6;
        (pAVar4->rtc_ref).ref_idx[0] = 2;
        (pAVar4->rtc_ref).ref_idx[1] = 6;
        if ((cpi->svc).number_temporal_layers + -1 <= (cpi->svc).temporal_layer_id) {
          return;
        }
        (pAVar4->rtc_ref).ref_idx[2] = 7;
        (pAVar4->rtc_ref).refresh[7] = 1;
        return;
      }
      (pAVar4->rtc_ref).ref_idx[2] = 5;
      (pAVar4->rtc_ref).ref_idx[3] = 5;
      (pAVar4->rtc_ref).ref_idx[4] = 5;
      (pAVar4->rtc_ref).ref_idx[5] = 5;
      (pAVar4->rtc_ref).ref_idx[6] = 5;
      (pAVar4->rtc_ref).ref_idx[0] = 1;
      (pAVar4->rtc_ref).ref_idx[1] = 5;
      if (((cpi->svc).number_temporal_layers + -1 <= (cpi->svc).temporal_layer_id) &&
         ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id)) {
        return;
      }
      (pAVar4->rtc_ref).ref_idx[2] = 6;
      (pAVar4->rtc_ref).refresh[6] = 1;
      return;
    }
    if (iVar3 != 0) {
      return;
    }
    iVar3 = (cpi->svc).spatial_layer_id;
    if (iVar3 == 0) {
      (pAVar4->rtc_ref).ref_idx[3] = 0;
      (pAVar4->rtc_ref).ref_idx[4] = 0;
      (pAVar4->rtc_ref).ref_idx[5] = 0;
      (pAVar4->rtc_ref).ref_idx[6] = 0;
      piVar1[0] = 0;
      piVar1[1] = 0;
      piVar1[2] = 0;
      piVar1[3] = 0;
      (pAVar4->rtc_ref).refresh[0] = 1;
      return;
    }
    if (iVar3 == 1) {
      (pAVar4->rtc_ref).ref_idx[1] = 0;
      (pAVar4->rtc_ref).ref_idx[2] = 0;
      (pAVar4->rtc_ref).ref_idx[3] = 0;
      (pAVar4->rtc_ref).ref_idx[4] = 0;
      (pAVar4->rtc_ref).ref_idx[5] = 0;
      (pAVar4->rtc_ref).ref_idx[6] = 0;
      (pAVar4->rtc_ref).ref_idx[0] = 1;
      (pAVar4->rtc_ref).refresh[1] = 1;
      return;
    }
    if (iVar3 != 2) {
      return;
    }
    (pAVar4->rtc_ref).ref_idx[2] = 1;
    (pAVar4->rtc_ref).ref_idx[3] = 1;
    (pAVar4->rtc_ref).ref_idx[4] = 1;
    (pAVar4->rtc_ref).ref_idx[5] = 1;
    (pAVar4->rtc_ref).ref_idx[6] = 1;
    (pAVar4->rtc_ref).ref_idx[0] = 2;
    (pAVar4->rtc_ref).ref_idx[1] = 1;
    (pAVar4->rtc_ref).refresh[2] = 1;
    return;
  }
  if ((uVar2 - 1 & 3) == 0) {
    iVar3 = (cpi->svc).spatial_layer_id;
    if (iVar3 == 0) {
      (pAVar4->rtc_ref).ref_idx[3] = 0;
      (pAVar4->rtc_ref).ref_idx[4] = 0;
      (pAVar4->rtc_ref).ref_idx[5] = 0;
      (pAVar4->rtc_ref).ref_idx[6] = 0;
      piVar1[0] = 0;
      piVar1[1] = 0;
      piVar1[2] = 0;
      piVar1[3] = 0;
      goto LAB_00a94c0e;
    }
    if (iVar3 != 1) {
      if (iVar3 != 2) {
        return;
      }
      (pAVar4->rtc_ref).ref_idx[2] = 4;
      (pAVar4->rtc_ref).ref_idx[3] = 4;
      (pAVar4->rtc_ref).ref_idx[4] = 4;
      (pAVar4->rtc_ref).ref_idx[5] = 4;
      (pAVar4->rtc_ref).ref_idx[6] = 4;
      (pAVar4->rtc_ref).ref_idx[0] = 2;
      (pAVar4->rtc_ref).ref_idx[1] = 4;
      return;
    }
    (pAVar4->rtc_ref).ref_idx[2] = 3;
    (pAVar4->rtc_ref).ref_idx[3] = 3;
    (pAVar4->rtc_ref).ref_idx[4] = 3;
    (pAVar4->rtc_ref).ref_idx[5] = 3;
    (pAVar4->rtc_ref).ref_idx[6] = 3;
    (pAVar4->rtc_ref).ref_idx[0] = 1;
    (pAVar4->rtc_ref).ref_idx[1] = 3;
  }
  else {
    if ((uVar2 + 1 & 3) != 0) {
      return;
    }
    iVar3 = (cpi->svc).spatial_layer_id;
    if (iVar3 == 0) {
      (pAVar4->rtc_ref).ref_idx[1] = 0;
      (pAVar4->rtc_ref).ref_idx[2] = 0;
      (pAVar4->rtc_ref).ref_idx[3] = 0;
      (pAVar4->rtc_ref).ref_idx[4] = 0;
      (pAVar4->rtc_ref).ref_idx[5] = 0;
      (pAVar4->rtc_ref).ref_idx[6] = 0;
      (pAVar4->rtc_ref).ref_idx[0] = 5;
LAB_00a94c0e:
      if ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id) {
        return;
      }
      (pAVar4->rtc_ref).ref_idx[3] = 3;
      (pAVar4->rtc_ref).refresh[3] = 1;
      return;
    }
    if (iVar3 != 1) {
      if (iVar3 != 2) {
        return;
      }
      (pAVar4->rtc_ref).ref_idx[1] = 0;
      (pAVar4->rtc_ref).ref_idx[2] = 0;
      (pAVar4->rtc_ref).ref_idx[3] = 0;
      (pAVar4->rtc_ref).ref_idx[4] = 0;
      (pAVar4->rtc_ref).ref_idx[5] = 0;
      (pAVar4->rtc_ref).ref_idx[6] = 0;
      (pAVar4->rtc_ref).ref_idx[0] = 7;
      (pAVar4->rtc_ref).ref_idx[3] = 4;
      return;
    }
    (pAVar4->rtc_ref).ref_idx[1] = 0;
    (pAVar4->rtc_ref).ref_idx[2] = 0;
    (pAVar4->rtc_ref).ref_idx[3] = 0;
    (pAVar4->rtc_ref).ref_idx[4] = 0;
    (pAVar4->rtc_ref).ref_idx[5] = 0;
    (pAVar4->rtc_ref).ref_idx[6] = 0;
    (pAVar4->rtc_ref).ref_idx[0] = 6;
    (pAVar4->rtc_ref).ref_idx[3] = 3;
  }
  if ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id) {
    return;
  }
  (pAVar4->rtc_ref).ref_idx[1] = 4;
  (pAVar4->rtc_ref).refresh[4] = 1;
  return;
}

Assistant:

void av1_set_svc_fixed_mode(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  int i;
  assert(svc->use_flexible_mode == 0);
  // Fixed SVC mode only supports at most 3 spatial or temporal layers.
  assert(svc->number_spatial_layers >= 1 && svc->number_spatial_layers <= 3 &&
         svc->number_temporal_layers >= 1 && svc->number_temporal_layers <= 3);
  rtc_ref->set_ref_frame_config = 1;
  int superframe_cnt = svc->current_superframe;
  // Set the reference map buffer idx for the 7 references:
  // LAST_FRAME (0), LAST2_FRAME(1), LAST3_FRAME(2), GOLDEN_FRAME(3),
  // BWDREF_FRAME(4), ALTREF2_FRAME(5), ALTREF_FRAME(6).
  for (i = 0; i < INTER_REFS_PER_FRAME; i++) {
    rtc_ref->reference[i] = 0;
    rtc_ref->ref_idx[i] = i;
  }
  for (i = 0; i < REF_FRAMES; i++) rtc_ref->refresh[i] = 0;
  // Always reference LAST, and reference GOLDEN on SL > 0.
  // For KSVC: GOLDEN reference will be removed on INTER_FRAMES later
  // when frame_type is set.
  rtc_ref->reference[SVC_LAST_FRAME] = 1;
  if (svc->spatial_layer_id > 0) rtc_ref->reference[SVC_GOLDEN_FRAME] = 1;
  if (svc->temporal_layer_id == 0) {
    // Base temporal layer.
    if (svc->spatial_layer_id == 0) {
      // Set all buffer_idx to 0. Update slot 0 (LAST).
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->refresh[0] = 1;
    } else if (svc->spatial_layer_id == 1) {
      // Set buffer_idx for LAST to slot 1, GOLDEN (and all other refs) to
      // slot 0. Update slot 1 (LAST).
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 1;
      rtc_ref->refresh[1] = 1;
    } else if (svc->spatial_layer_id == 2) {
      // Set buffer_idx for LAST to slot 2, GOLDEN (and all other refs) to
      // slot 1. Update slot 2 (LAST).
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 1;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 2;
      rtc_ref->refresh[2] = 1;
    }
  } else if (svc->temporal_layer_id == 2 && (superframe_cnt - 1) % 4 == 0) {
    // First top temporal enhancement layer.
    if (svc->spatial_layer_id == 0) {
      // Reference LAST (slot 0).
      // Set GOLDEN to slot 3 and update slot 3.
      // Set all other buffer_idx to slot 0.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      if (svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 3;
        rtc_ref->refresh[3] = 1;
      }
    } else if (svc->spatial_layer_id == 1) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 1,
      // GOLDEN (and all other refs) to slot 3.
      // Set LAST2 to slot 4 and Update slot 4.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 3;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 1;
      if (svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_LAST2_FRAME] = 4;
        rtc_ref->refresh[4] = 1;
      }
    } else if (svc->spatial_layer_id == 2) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 2,
      // GOLDEN (and all other refs) to slot 4.
      // No update.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 4;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 2;
    }
  } else if (svc->temporal_layer_id == 1) {
    // Middle temporal enhancement layer.
    if (svc->spatial_layer_id == 0) {
      // Reference LAST.
      // Set all buffer_idx to 0.
      // Set GOLDEN to slot 5 and update slot 5.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      if (svc->temporal_layer_id < svc->number_temporal_layers - 1 ||
          svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 5;
        rtc_ref->refresh[5] = 1;
      }
    } else if (svc->spatial_layer_id == 1) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 1,
      // GOLDEN (and all other refs) to slot 5.
      // Set LAST3 to slot 6 and update slot 6.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 5;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 1;
      if (svc->temporal_layer_id < svc->number_temporal_layers - 1 ||
          svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_LAST3_FRAME] = 6;
        rtc_ref->refresh[6] = 1;
      }
    } else if (svc->spatial_layer_id == 2) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 2,
      // GOLDEN (and all other refs) to slot 6.
      // Set LAST3 to slot 7 and update slot 7.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 6;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 2;
      if (svc->temporal_layer_id < svc->number_temporal_layers - 1) {
        rtc_ref->ref_idx[SVC_LAST3_FRAME] = 7;
        rtc_ref->refresh[7] = 1;
      }
    }
  } else if (svc->temporal_layer_id == 2 && (superframe_cnt - 3) % 4 == 0) {
    // Second top temporal enhancement layer.
    if (svc->spatial_layer_id == 0) {
      // Set LAST to slot 5 and reference LAST.
      // Set GOLDEN to slot 3 and update slot 3.
      // Set all other buffer_idx to 0.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 5;
      if (svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 3;
        rtc_ref->refresh[3] = 1;
      }
    } else if (svc->spatial_layer_id == 1) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 6,
      // GOLDEN to slot 3. Set LAST2 to slot 4 and update slot 4.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 6;
      rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 3;
      if (svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_LAST2_FRAME] = 4;
        rtc_ref->refresh[4] = 1;
      }
    } else if (svc->spatial_layer_id == 2) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 7,
      // GOLDEN to slot 4. No update.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 7;
      rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 4;
    }
  }
}